

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcRootLogLikelihoodsPerCategory
          (BeagleCPUImpl<float,_1,_0> *this,int bufferIndex,int stateFrequenciesIndex,
          int scalingFactorsIndex,double *outLogLikelihoodPerCategory)

{
  int iVar1;
  uint uVar2;
  float *pfVar3;
  float *pfVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  double dVar11;
  undefined1 auVar12 [16];
  
  iVar10 = this->kCategoryCount;
  if (0 < iVar10) {
    pfVar3 = this->gPartials[bufferIndex];
    pfVar4 = this->gStateFrequencies[stateFrequenciesIndex];
    lVar9 = 0;
    iVar5 = 0;
    iVar7 = 0;
    do {
      if (0 < this->kPatternCount) {
        lVar9 = (long)(int)lVar9;
        iVar10 = 0;
        do {
          iVar1 = this->kStateCount;
          if ((long)iVar1 < 1) {
            dVar11 = 0.0;
          }
          else {
            auVar12 = ZEXT816(0);
            lVar6 = 0;
            do {
              auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)pfVar3[iVar7 + lVar6]),
                                        ZEXT416((uint)pfVar4[lVar6]));
              lVar6 = lVar6 + 1;
            } while (iVar1 != lVar6);
            iVar7 = iVar7 + iVar1;
            dVar11 = (double)auVar12._0_4_;
          }
          dVar11 = log(dVar11);
          outLogLikelihoodPerCategory[lVar9] = dVar11;
          lVar9 = lVar9 + 1;
          iVar10 = iVar10 + 1;
        } while (iVar10 < this->kPatternCount);
      }
      iVar5 = iVar5 + 1;
      iVar10 = this->kCategoryCount;
    } while (iVar5 < iVar10);
  }
  if ((-1 < scalingFactorsIndex) && (0 < iVar10)) {
    pfVar3 = this->gScaleBuffers[(uint)scalingFactorsIndex];
    uVar2 = this->kPatternCount;
    iVar5 = 0;
    iVar7 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar8 = 0;
        do {
          outLogLikelihoodPerCategory[(long)iVar7 + uVar8] =
               (double)pfVar3[uVar8] + outLogLikelihoodPerCategory[(long)iVar7 + uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar2 != uVar8);
        iVar7 = iVar7 + (int)uVar8;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != iVar10);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsPerCategory(
        const int bufferIndex,
        const int stateFrequenciesIndex,
        const int scalingFactorsIndex,
        double* outLogLikelihoodPerCategory) {

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* rootPartials = gPartials[bufferIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];

    int u = 0;
    int v = 0;
    for (int l = 0; l < kCategoryCount; l++) {
        for (int k = 0; k < kPatternCount; k++) {
            REALTYPE sum = 0.0;
            for (int i = 0; i < kStateCount; i++) {
                sum += rootPartials[v] * freqs[i];
                v++;
            }
            outLogLikelihoodPerCategory[u] = log(sum);
            u++;
            v += P_PAD;
        }
    }

    if (scalingFactorsIndex >= 0) {
        const REALTYPE* cumulativeScaleFactors = gScaleBuffers[scalingFactorsIndex];
        int u = 0;
        for (int l = 0; l < kCategoryCount; l++) {
            for (int i = 0; i < kPatternCount; i++) {
                outLogLikelihoodPerCategory[u] += cumulativeScaleFactors[i];
                u++;
            }
        }
    }

    return returnCode;
}